

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_all_resolve_element
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue val_00;
  JSValue errors;
  JSValue this_obj;
  JSValue resolve_element_env_00;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue val_01;
  JSValue val_02;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue v_02;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSContext *in_RDI;
  JSValue *in_R8;
  uint in_R9D;
  JSValue JVar4;
  undefined8 *in_stack_00000008;
  JSValue error;
  JSValue str;
  int index;
  int is_zero;
  JSValue obj;
  JSValue ret;
  JSValue resolve_element_env;
  JSValue resolve;
  JSValue values;
  BOOL alreadyCalled;
  int is_reject;
  int resolve_type;
  JSContext *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  JSContext *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  JSAtom in_stack_fffffffffffffeb4;
  JSValueUnion in_stack_fffffffffffffeb8;
  JSValueUnion in_stack_fffffffffffffec0;
  JSValueUnion JVar5;
  int64_t in_stack_fffffffffffffec8;
  JSValueUnion in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffed8;
  JSValueUnion in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff20;
  JSValueUnion local_a8;
  int64_t local_a0;
  int32_t local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar4.u._4_4_ = in_stack_fffffffffffffe8c;
  JVar4.u.int32 = in_stack_fffffffffffffe88;
  JVar4.tag = (int64_t)in_stack_fffffffffffffe90;
  iVar2 = JS_ToBool((JSContext *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),JVar4
                   );
  val.u._4_4_ = in_stack_fffffffffffffe9c;
  val.u.int32 = in_stack_fffffffffffffe98;
  val.tag._0_4_ = in_stack_fffffffffffffea0;
  val.tag._4_4_ = in_stack_fffffffffffffea4;
  iVar3 = JS_ToInt32(in_stack_fffffffffffffe90,
                     (int32_t *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),val);
  if (iVar3 != 0) {
    local_30 = 0;
    local_28 = 6;
    goto LAB_0018418c;
  }
  if (iVar2 != 0) {
    local_30 = 0;
    local_28 = 3;
    goto LAB_0018418c;
  }
  *in_stack_00000008 = CONCAT44(uStack_c,1);
  in_stack_00000008[1] = 1;
  if ((in_R9D & 3) == 1) {
    JVar4 = JS_NewObject((JSContext *)0x183cc6);
    iVar2 = JS_IsException(JVar4);
    if (iVar2 != 0) {
      local_30 = 0;
      local_28 = 6;
      goto LAB_0018418c;
    }
    JVar4 = JS_NewString((JSContext *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    in_stack_ffffffffffffff20 = JVar4.u._0_4_;
    iVar2 = JS_IsException(JVar4);
    if ((iVar2 == 0) &&
       (this_obj_02.tag = in_stack_fffffffffffffed8,
       this_obj_02.u.ptr = in_stack_fffffffffffffed0.ptr, val_01.tag = in_stack_fffffffffffffec8,
       val_01.u.ptr = in_stack_fffffffffffffec0.ptr,
       iVar2 = JS_DefinePropertyValue
                         ((JSContext *)in_stack_fffffffffffffeb8.ptr,this_obj_02,
                          in_stack_fffffffffffffeb4,val_01,in_stack_fffffffffffffef0), -1 < iVar2))
    {
      in_stack_fffffffffffffe7c = 0x40;
      if ((in_R9D & 4) != 0) {
        in_stack_fffffffffffffe7c = 0x89;
      }
      JVar4 = JS_DupValue(in_RDI,*in_R8);
      this_obj_03.tag = in_stack_fffffffffffffed8;
      this_obj_03.u.ptr = in_stack_fffffffffffffed0.ptr;
      val_02.tag = in_stack_fffffffffffffec8;
      val_02.u.ptr = in_stack_fffffffffffffec0.ptr;
      iVar2 = JS_DefinePropertyValue
                        ((JSContext *)in_stack_fffffffffffffeb8.ptr,this_obj_03,
                         in_stack_fffffffffffffeb4,val_02,JVar4.u._0_4_);
      in_stack_fffffffffffffe70 = in_RDI;
      if (-1 < iVar2) goto LAB_00183ef8;
    }
    v.u._4_4_ = in_stack_fffffffffffffe7c;
    v.u.int32 = in_stack_fffffffffffffe78;
    v.tag._0_4_ = in_stack_fffffffffffffe80;
    v.tag._4_4_ = in_stack_fffffffffffffe84;
    JS_FreeValue(in_stack_fffffffffffffe70,v);
    local_30 = 0;
    local_28 = 6;
  }
  else {
    JVar4 = JS_DupValue(in_RDI,*in_R8);
    in_stack_fffffffffffffee0 = JVar4.u;
    in_RDI = in_stack_fffffffffffffe70;
LAB_00183ef8:
    this_obj.tag._0_4_ = in_stack_fffffffffffffeb0;
    this_obj.u.ptr = (void *)in_stack_fffffffffffffea8;
    this_obj.tag._4_4_ = in_stack_fffffffffffffeb4;
    val_00.u._4_4_ = in_stack_fffffffffffffe9c;
    val_00.u.int32 = in_stack_fffffffffffffe98;
    val_00.tag._0_4_ = in_stack_fffffffffffffea0;
    val_00.tag._4_4_ = in_stack_fffffffffffffea4;
    iVar2 = JS_DefinePropertyValueUint32
                      (in_stack_fffffffffffffe90,this_obj,in_stack_fffffffffffffe8c,val_00,
                       in_stack_ffffffffffffff20);
    if (iVar2 < 0) {
      local_30 = 0;
      local_28 = 6;
    }
    else {
      resolve_element_env_00.tag._0_4_ = in_stack_fffffffffffffeb0;
      resolve_element_env_00.u.ptr = (void *)in_stack_fffffffffffffea8;
      resolve_element_env_00.tag._4_4_ = in_stack_fffffffffffffeb4;
      iVar2 = remainingElementsCount_add
                        ((JSContext *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         resolve_element_env_00,in_stack_fffffffffffffe9c);
      if (iVar2 < 0) {
        local_30 = 0;
        local_28 = 6;
      }
      else {
        if (iVar2 != 0) {
          if ((in_R9D & 3) == 2) {
            errors.u._4_4_ = in_stack_fffffffffffffe9c;
            errors.u.int32 = in_stack_fffffffffffffe98;
            errors.tag._0_4_ = in_stack_fffffffffffffea0;
            errors.tag._4_4_ = in_stack_fffffffffffffea4;
            JVar4 = js_aggregate_error_constructor(in_stack_fffffffffffffe90,errors);
            JVar5 = JVar4.u;
            iVar2 = JS_IsException(JVar4);
            if (iVar2 != 0) {
              local_30 = 0;
              local_28 = 6;
              goto LAB_0018418c;
            }
            func_obj.tag = (int64_t)JVar5.ptr;
            func_obj.u.ptr = in_stack_fffffffffffffeb8.ptr;
            this_obj_00.tag._0_4_ = in_stack_fffffffffffffeb0;
            this_obj_00.u.float64 = 1.48219693752374e-323;
            this_obj_00.tag._4_4_ = in_stack_fffffffffffffeb4;
            JVar4 = JS_Call((JSContext *)((ulong)in_stack_fffffffffffffea4 << 0x20),func_obj,
                            this_obj_00,in_stack_fffffffffffffe9c,
                            (JSValue *)in_stack_fffffffffffffee0.ptr);
            local_a0 = JVar4.tag;
            local_a8 = JVar4.u;
            v_00.u._4_4_ = in_stack_fffffffffffffe7c;
            v_00.u.int32 = in_stack_fffffffffffffe78;
            v_00.tag._0_4_ = in_stack_fffffffffffffe80;
            v_00.tag._4_4_ = in_stack_fffffffffffffe84;
            JS_FreeValue(in_RDI,v_00);
          }
          else {
            in_stack_fffffffffffffe80 = 0;
            func_obj_00.tag = (int64_t)in_stack_fffffffffffffec0.ptr;
            func_obj_00.u.ptr = in_stack_fffffffffffffeb8.ptr;
            this_obj_01.tag._0_4_ = in_stack_fffffffffffffeb0;
            this_obj_01.u.ptr = (void *)in_stack_fffffffffffffea8;
            this_obj_01.tag._4_4_ = in_stack_fffffffffffffeb4;
            JVar4 = JS_Call((JSContext *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            func_obj_00,this_obj_01,in_stack_fffffffffffffe9c,
                            (JSValue *)in_stack_fffffffffffffee0.ptr);
            local_a8 = JVar4.u;
            local_a0 = JVar4.tag;
          }
          v_02.tag = local_a0;
          v_02.u.float64 = local_a8.float64;
          iVar2 = JS_IsException(v_02);
          if (iVar2 != 0) {
            local_30 = local_a8.int32;
            uStack_2c = local_a8._4_4_;
            local_28 = local_a0;
            goto LAB_0018418c;
          }
          v_01.u._4_4_ = in_stack_fffffffffffffe7c;
          v_01.u.int32 = in_stack_fffffffffffffe78;
          v_01.tag._0_4_ = in_stack_fffffffffffffe80;
          v_01.tag._4_4_ = in_stack_fffffffffffffe84;
          JS_FreeValue(in_RDI,v_01);
        }
        local_30 = 0;
        local_28 = 3;
      }
    }
  }
LAB_0018418c:
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_promise_all_resolve_element(JSContext *ctx,
                                              JSValueConst this_val,
                                              int argc, JSValueConst *argv,
                                              int magic,
                                              JSValue *func_data)
{
    int resolve_type = magic & 3;
    int is_reject = magic & 4;
    BOOL alreadyCalled = JS_ToBool(ctx, func_data[0]);
    JSValueConst values = func_data[2];
    JSValueConst resolve = func_data[3];
    JSValueConst resolve_element_env = func_data[4];
    JSValue ret, obj;
    int is_zero, index;
    
    if (JS_ToInt32(ctx, &index, func_data[1]))
        return JS_EXCEPTION;
    if (alreadyCalled)
        return JS_UNDEFINED;
    func_data[0] = JS_NewBool(ctx, TRUE);

    if (resolve_type == PROMISE_MAGIC_allSettled) {
        JSValue str;
        
        obj = JS_NewObject(ctx);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        str = JS_NewString(ctx, is_reject ? "rejected" : "fulfilled");
        if (JS_IsException(str))
            goto fail1;
        if (JS_DefinePropertyValue(ctx, obj, JS_ATOM_status,
                                   str,
                                   JS_PROP_C_W_E) < 0)
            goto fail1;
        if (JS_DefinePropertyValue(ctx, obj,
                                   is_reject ? JS_ATOM_reason : JS_ATOM_value,
                                   JS_DupValue(ctx, argv[0]),
                                   JS_PROP_C_W_E) < 0) {
        fail1:
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    } else {
        obj = JS_DupValue(ctx, argv[0]);
    }
    if (JS_DefinePropertyValueUint32(ctx, values, index,
                                     obj, JS_PROP_C_W_E) < 0)
        return JS_EXCEPTION;
    
    is_zero = remainingElementsCount_add(ctx, resolve_element_env, -1);
    if (is_zero < 0)
        return JS_EXCEPTION;
    if (is_zero) {
        if (resolve_type == PROMISE_MAGIC_any) {
            JSValue error;
            error = js_aggregate_error_constructor(ctx, values);
            if (JS_IsException(error))
                return JS_EXCEPTION;
            ret = JS_Call(ctx, resolve, JS_UNDEFINED, 1, (JSValueConst *)&error);
            JS_FreeValue(ctx, error);
        } else {
            ret = JS_Call(ctx, resolve, JS_UNDEFINED, 1, (JSValueConst *)&values);
        }
        if (JS_IsException(ret))
            return ret;
        JS_FreeValue(ctx, ret);
    }
    return JS_UNDEFINED;
}